

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O1

void __thiscall rapic::scan::reset(scan *this)

{
  pointer prVar1;
  pointer puVar2;
  
  std::vector<rapic::header,_std::allocator<rapic::header>_>::_M_erase_at_end
            (&this->headers_,
             (this->headers_).super__Vector_base<rapic::header,_std::allocator<rapic::header>_>.
             _M_impl.super__Vector_impl_data._M_start);
  prVar1 = (this->ray_headers_).
           super__Vector_base<rapic::ray_header,_std::allocator<rapic::ray_header>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ray_headers_).super__Vector_base<rapic::ray_header,_std::allocator<rapic::ray_header>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar1) {
    (this->ray_headers_).super__Vector_base<rapic::ray_header,_std::allocator<rapic::ray_header>_>.
    _M_impl.super__Vector_impl_data._M_finish = prVar1;
  }
  this->rays_ = 0;
  this->bins_ = 0;
  puVar2 = (this->level_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->level_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->level_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  this->station_id_ = -1;
  this->volume_id_ = -1;
  (this->product_)._M_string_length = 0;
  *(this->product_)._M_dataplus._M_p = '\0';
  this->pass_ = -1;
  this->pass_count_ = -1;
  this->is_rhi_ = false;
  this->angle_min_ = NAN;
  this->angle_max_ = NAN;
  this->angle_resolution_ = NAN;
  return;
}

Assistant:

auto scan::reset() -> void
{
  headers_.clear();
  ray_headers_.clear();
  rays_ = 0;
  bins_ = 0;
  level_data_.clear();

  station_id_ = -1;
  volume_id_ = -1;
  product_.clear();
  pass_ = -1;
  pass_count_ = -1;
  is_rhi_ = false;
  angle_min_ = fnan;
  angle_max_ = fnan;
  angle_resolution_ = fnan;
}